

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.cpp
# Opt level: O3

bool __thiscall TRM::TGAImage::flip_vertically(TGAImage *this)

{
  uchar *__src;
  uchar *puVar1;
  uchar *puVar2;
  uint uVar3;
  void *__dest;
  ulong uVar4;
  int iVar5;
  long lVar6;
  unsigned_long l1;
  long lVar7;
  ulong __n;
  
  puVar1 = this->data;
  if (puVar1 != (uchar *)0x0) {
    __n = (long)this->bytespp * (long)this->width;
    __dest = operator_new__(__n);
    uVar3 = this->height >> 1;
    if (0 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
      iVar5 = -1;
      lVar7 = 0;
      do {
        lVar6 = (long)(this->height + iVar5) * __n;
        puVar2 = this->data;
        __src = puVar2 + lVar7;
        memmove(__dest,__src,__n);
        memmove(__src,puVar2 + lVar6,__n);
        memmove(this->data + lVar6,__dest,__n);
        lVar7 = lVar7 + __n;
        iVar5 = iVar5 + -1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    operator_delete__(__dest);
  }
  return puVar1 != (uchar *)0x0;
}

Assistant:

bool TGAImage::flip_vertically() {
  if (!data) return false;
  unsigned long bytes_per_line = width * bytespp;
  unsigned char *line = new unsigned char[bytes_per_line];
  int half = height >> 1;
  for (int j = 0; j < half; j++) {
    unsigned long l1 = j * bytes_per_line;
    unsigned long l2 = (height - 1 - j) * bytes_per_line;
    memmove((void *)line, (void *)(data + l1), bytes_per_line);
    memmove((void *)(data + l1), (void *)(data + l2), bytes_per_line);
    memmove((void *)(data + l2), (void *)line, bytes_per_line);
  }
  delete[] line;
  return true;
}